

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O2

ssize_t __thiscall
avro::anon_unknown_3::IStreamBufferCopyIn::read
          (IStreamBufferCopyIn *this,int __fd,void *__buf,size_t __nbytes)

{
  istream *piVar1;
  long lVar2;
  long lVar3;
  ssize_t sVar4;
  undefined4 in_register_00000034;
  
  std::istream::read((char *)this->is_,CONCAT44(in_register_00000034,__fd));
  piVar1 = this->is_;
  lVar2 = *(long *)piVar1;
  if (((byte)piVar1[*(long *)(lVar2 + -0x18) + 0x20] & 1) == 0) {
    lVar3 = *(long *)(piVar1 + 8);
    *(long *)__nbytes = lVar3;
    sVar4 = CONCAT71((int7)((ulong)piVar1 >> 8),
                     lVar3 != 0 || ((byte)piVar1[*(long *)(lVar2 + -0x18) + 0x20] & 2) == 0);
  }
  else {
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

bool read(uint8_t* b, size_t toRead, size_t& actual) {
        is_.read(reinterpret_cast<char*>(b), toRead);
        if (is_.bad()) {
            return false;
        }
        actual = static_cast<size_t>(is_.gcount());
        return (! is_.eof() || actual != 0);
    }